

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O1

void __thiscall amrex::MultiFab::WeightedSync(MultiFab *this,MultiFab *wgt,Periodicity *period)

{
  int ncomp;
  uint uVar1;
  int dstcomp;
  MultiFab tmpmf;
  MFInfo local_1e8;
  IntVect local_1bc;
  FabArray<amrex::FArrayBox> local_1b0;
  
  uVar1 = 0;
  switch((this->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_bat_type) {
  case null:
  case coarsenRatio:
    break;
  case indexType:
  case indexType_coarsenRatio:
    uVar1 = (this->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_op.
            m_indexType.m_typ.itype;
    break;
  default:
    uVar1 = (this->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_op.
            m_bndryReg.m_typ.itype;
  }
  if (uVar1 != 0) {
    ncomp = (this->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
    if (0 < ncomp) {
      dstcomp = 0;
      do {
        local_1b0.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)0x0;
        local_1b0.super_FabArrayBase.boxarray.m_bat.m_bat_type = null;
        Multiply<amrex::FArrayBox,void>
                  (&this->super_FabArray<amrex::FArrayBox>,&wgt->super_FabArray<amrex::FArrayBox>,0,
                   dstcomp,1,(IntVect *)&local_1b0);
        dstcomp = dstcomp + 1;
      } while (ncomp != dstcomp);
    }
    local_1e8.alloc = true;
    local_1e8._1_7_ = 0;
    local_1e8.arena = (Arena *)0x0;
    local_1e8.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1bc.vect[0] = 0;
    local_1bc.vect[1] = 0;
    local_1bc.vect[2] = 0;
    MultiFab((MultiFab *)&local_1b0,
             &(this->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
             &(this->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,ncomp,
             &local_1bc,&local_1e8,
             (this->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1e8.tags.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (&local_1b0,0.0,0,local_1b0.super_FabArrayBase.n_comp,
               &local_1b0.super_FabArrayBase.n_grow);
    FabArray<amrex::FArrayBox>::ParallelCopy
              (&local_1b0,&this->super_FabArray<amrex::FArrayBox>,period,ADD);
    local_1e8.alloc = false;
    local_1e8._1_7_ = 0;
    local_1e8.arena = (Arena *)((ulong)local_1e8.arena & 0xffffffff00000000);
    Copy<amrex::FArrayBox,void>
              (&this->super_FabArray<amrex::FArrayBox>,&local_1b0,0,0,ncomp,(IntVect *)&local_1e8);
    FabArray<amrex::FArrayBox>::~FabArray(&local_1b0);
  }
  return;
}

Assistant:

void
MultiFab::WeightedSync (const MultiFab& wgt, const Periodicity& period)
{
    BL_PROFILE("MultiFab::WeightedSync()");

    if (ixType().cellCentered()) return;

    const int ncomp = nComp();
    for (int comp = 0; comp < ncomp; ++comp)
    {
        MultiFab::Multiply(*this, wgt, 0, comp, 1, 0);
    }

    MultiFab tmpmf(boxArray(), DistributionMap(), ncomp, 0, MFInfo(), Factory());
    tmpmf.setVal(Real(0.0));
    tmpmf.ParallelCopy(*this, period, FabArrayBase::ADD);

    MultiFab::Copy(*this, tmpmf, 0, 0, ncomp, 0);
}